

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O3

Spl_Man_t * Spl_ManAlloc(Gia_Man_t *pGia,int Limit,int fReverse)

{
  uint uVar1;
  uint uVar2;
  Spl_Man_t *pSVar3;
  Vec_Bit_t *pVVar4;
  long lVar5;
  byte *__s;
  int *piVar6;
  Vec_Int_t *pVVar7;
  Vec_Wec_t *pVVar8;
  int iVar9;
  size_t sVar10;
  int iVar11;
  size_t sVar12;
  
  pSVar3 = (Spl_Man_t *)calloc(1,0x70);
  pSVar3->pGia = pGia;
  pSVar3->Limit = Limit;
  pSVar3->fReverse = fReverse;
  uVar1 = pGia->nObjs;
  iVar9 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
  pVVar4 = (Vec_Bit_t *)malloc(0x10);
  iVar11 = iVar9 * 0x20;
  pVVar4->nCap = iVar11;
  lVar5 = (long)iVar9;
  if (iVar9 == 0) {
    sVar10 = 0;
    __s = (byte *)0x0;
  }
  else {
    sVar10 = lVar5 * 4;
    __s = (byte *)malloc(sVar10);
  }
  pVVar4->pArray = (int *)__s;
  pVVar4->nSize = iVar11;
  sVar12 = 0;
  memset(__s,0,sVar10);
  pSVar3->vMarksCIO = pVVar4;
  pVVar4 = (Vec_Bit_t *)malloc(0x10);
  pVVar4->nCap = iVar11;
  if (iVar9 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    sVar12 = lVar5 * 4;
    piVar6 = (int *)malloc(sVar12);
  }
  pVVar4->pArray = piVar6;
  pVVar4->nSize = iVar11;
  sVar10 = 0;
  memset(piVar6,0,sVar12);
  pSVar3->vMarksIn = pVVar4;
  pVVar4 = (Vec_Bit_t *)malloc(0x10);
  pVVar4->nCap = iVar11;
  if (iVar9 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    sVar10 = lVar5 * 4;
    piVar6 = (int *)malloc(sVar10);
  }
  pVVar4->pArray = piVar6;
  pVVar4->nSize = iVar11;
  sVar12 = 0;
  memset(piVar6,0,sVar10);
  pSVar3->vMarksNo = pVVar4;
  pVVar4 = (Vec_Bit_t *)malloc(0x10);
  pVVar4->nCap = iVar11;
  if (iVar9 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    sVar12 = lVar5 << 2;
    piVar6 = (int *)malloc(sVar12);
  }
  pVVar4->pArray = piVar6;
  pVVar4->nSize = iVar11;
  memset(piVar6,0,sVar12);
  pSVar3->vMarksAnd = pVVar4;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pSVar3->vRoots = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pSVar3->vNodes = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pSVar3->vLeaves = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pSVar3->vAnds = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pSVar3->vFanouts = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pSVar3->vCands = pVVar7;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar6 = (int *)malloc(400);
  pVVar7->pArray = piVar6;
  pSVar3->vInputs = pVVar7;
  if (iVar9 < 1) {
LAB_007dc71e:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                  ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
  }
  *__s = *__s | 1;
  pVVar7 = pGia->vCis;
  if (0 < pVVar7->nSize) {
    piVar6 = pVVar7->pArray;
    lVar5 = 0;
    do {
      uVar2 = piVar6[lVar5];
      if (((int)uVar2 < 0) || ((int)uVar1 <= (int)uVar2)) goto LAB_007dc73d;
      if (uVar2 == 0) break;
      if (iVar11 <= (int)uVar2) goto LAB_007dc71e;
      *(uint *)(__s + (ulong)(uVar2 >> 5) * 4) =
           *(uint *)(__s + (ulong)(uVar2 >> 5) * 4) | 1 << ((byte)uVar2 & 0x1f);
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar7->nSize);
  }
  pVVar7 = pGia->vCos;
  if (0 < pVVar7->nSize) {
    piVar6 = pVVar7->pArray;
    lVar5 = 0;
    do {
      uVar2 = piVar6[lVar5];
      if (((int)uVar2 < 0) || ((int)uVar1 <= (int)uVar2)) {
LAB_007dc73d:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (uVar2 == 0) break;
      if (iVar11 <= (int)uVar2) goto LAB_007dc71e;
      *(uint *)(__s + (ulong)(uVar2 >> 5) * 4) =
           *(uint *)(__s + (ulong)(uVar2 >> 5) * 4) | 1 << ((byte)uVar2 & 0x1f);
      lVar5 = lVar5 + 1;
    } while (lVar5 < pVVar7->nSize);
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGia);
  Gia_ManSetLutRefs(pGia);
  if (pGia->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x8c,"Spl_Man_t *Spl_ManAlloc(Gia_Man_t *, int, int)");
  }
  if (pGia->vMapping2 != (Vec_Wec_t *)0x0) {
    __assert_fail("!Gia_ManHasMapping2(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSplit.c"
                  ,0x8d,"Spl_Man_t *Spl_ManAlloc(Gia_Man_t *, int, int)");
  }
  pVVar8 = Spl_ManToWecMapping(pGia);
  pGia->vMapping2 = pVVar8;
  pVVar7 = pGia->vMapping;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      pGia->vMapping->pArray = (int *)0x0;
      pVVar7 = pGia->vMapping;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_007dc702;
    }
    free(pVVar7);
    pGia->vMapping = (Vec_Int_t *)0x0;
  }
LAB_007dc702:
  Gia_ManStaticFanoutStart(pGia);
  return pSVar3;
}

Assistant:

Spl_Man_t * Spl_ManAlloc( Gia_Man_t * pGia, int Limit, int fReverse )
{
    int i, iObj;
    Spl_Man_t * p = ABC_CALLOC( Spl_Man_t, 1 );
    p->pGia       = pGia;
    p->Limit      = Limit;
    p->fReverse   = fReverse;
    // intermediate
    p->vMarksCIO  = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->vMarksIn   = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->vMarksNo   = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->vMarksAnd  = Vec_BitStart( Gia_ManObjNum(pGia) );
    p->vRoots     = Vec_IntAlloc( 100 );
    p->vNodes     = Vec_IntAlloc( 100 );
    p->vLeaves    = Vec_IntAlloc( 100 );
    p->vAnds      = Vec_IntAlloc( 100 );
    // temporary 
    p->vFanouts   = Vec_IntAlloc( 100 );
    p->vCands     = Vec_IntAlloc( 100 );
    p->vInputs    = Vec_IntAlloc( 100 );
    // mark CIs/COs
    Vec_BitWriteEntry( p->vMarksCIO, 0, 1 );
    Gia_ManForEachCiId( pGia, iObj, i )
        Vec_BitWriteEntry( p->vMarksCIO, iObj, 1 );
    Gia_ManForEachCoId( pGia, iObj, i )
        Vec_BitWriteEntry( p->vMarksCIO, iObj, 1 );
    // mapping
    ABC_FREE( pGia->pRefs );
    Gia_ManCreateRefs( pGia );
    Gia_ManSetLutRefs( pGia );
    assert( Gia_ManHasMapping(pGia) );
    assert( !Gia_ManHasMapping2(pGia) );
    pGia->vMapping2 = Spl_ManToWecMapping( pGia );
    Vec_IntFreeP( &pGia->vMapping );
    // fanout
    Gia_ManStaticFanoutStart( pGia );
    return p;
}